

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentLeafNameTypeVector.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ContentLeafNameTypeVector::ContentLeafNameTypeVector
          (ContentLeafNameTypeVector *this,ContentLeafNameTypeVector *toCopy)

{
  NodeTypes NVar1;
  XMLSize_t XVar2;
  QName *pQVar3;
  ulong local_20;
  XMLSize_t i;
  ContentLeafNameTypeVector *toCopy_local;
  ContentLeafNameTypeVector *this_local;
  
  this->fMemoryManager = toCopy->fMemoryManager;
  this->fLeafNames = (QName **)0x0;
  this->fLeafTypes = (NodeTypes *)0x0;
  this->fLeafCount = 0;
  XVar2 = getLeafCount(toCopy);
  this->fLeafCount = XVar2;
  init(this,(EVP_PKEY_CTX *)this->fLeafCount);
  for (local_20 = 0; local_20 < this->fLeafCount; local_20 = local_20 + 1) {
    pQVar3 = getLeafNameAt(toCopy,local_20);
    this->fLeafNames[local_20] = pQVar3;
    NVar1 = getLeafTypeAt(toCopy,local_20);
    this->fLeafTypes[local_20] = NVar1;
  }
  return;
}

Assistant:

ContentLeafNameTypeVector::ContentLeafNameTypeVector
(
    const ContentLeafNameTypeVector& toCopy
)
: XMemory(toCopy)
, fMemoryManager(toCopy.fMemoryManager)
, fLeafNames(0)
, fLeafTypes(0)
, fLeafCount(0)
{
    fLeafCount=toCopy.getLeafCount();
    init(fLeafCount);

    for (XMLSize_t i=0; i<this->fLeafCount; i++)
    {
        fLeafNames[i] = toCopy.getLeafNameAt(i);
        fLeafTypes[i] = toCopy.getLeafTypeAt(i);
    }
}